

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O3

String __thiscall Network::Address::Ethernet::getAdapterName(Ethernet *this)

{
  int __fd;
  int iVar1;
  uchar *extraout_RDX;
  long in_RSI;
  char *s;
  long lVar2;
  String SVar3;
  char buf [1024];
  char local_428 [1024];
  
  __fd = socket(2,2,0);
  if (__fd != -1) {
    s = local_428;
    iVar1 = ioctl(__fd,0x8912);
    if (-1 < iVar1) {
      lVar2 = 0x19;
      do {
        iVar1 = ioctl(__fd,0x8927,s);
        if ((-1 < iVar1) &&
           (*(short *)(s + 0x16) == *(short *)(in_RSI + 0xc) &&
            *(int *)(s + 0x12) == *(int *)(in_RSI + 8))) {
          close(__fd);
          goto LAB_0010f443;
        }
        s = s + 0x28;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    close(__fd);
  }
  s = "";
LAB_0010f443:
  Bstrlib::String::String((String *)this,s);
  SVar3.super_tagbstring.data = extraout_RDX;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

String Ethernet::getAdapterName() const
        {
            int descriptor = socket(AF_INET, SOCK_DGRAM, 0);
            if (descriptor == -1) return "";
            // Then set the available options
            struct ifconf ifc = {}; // To enumerate all interfaces
            // Need to get the interface name based on its mac address
            // Get all interfaces
            char buf[1024];
            ifc.ifc_len = sizeof(buf);
            ifc.ifc_buf = buf;
            if (ioctl(descriptor, SIOCGIFCONF, &ifc) < 0) { close(descriptor); return ""; }

            // Find the given local interface
            struct ifreq * ifr = ifc.ifc_req;
    	    int nInterfaces = ifc.ifc_len / sizeof(struct ifreq);
    	    for(int i = 0; i < nInterfaces; i++)
    	    {
                // Get HW address for this interface
                if (ioctl(descriptor, SIOCGIFHWADDR, &ifr[i]) < 0) continue;
    		    if (memcmp(ifr[i].ifr_hwaddr.sa_data, address, ArrSz(address)) == 0)
                {
                    close(descriptor);
                    return ifr[i].ifr_name;
                }
            }
            close(descriptor);
            return "";
        }